

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

BOOL InitializeCriticalSectionAndSpinCount(LPCRITICAL_SECTION lpCriticalSection,DWORD dwSpinCount)

{
  if (PAL_InitializeChakraCoreCalled) {
    CorUnix::InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,dwSpinCount,false);
    if (PAL_InitializeChakraCoreCalled != false) {
      return 1;
    }
  }
  abort();
}

Assistant:

BOOL InitializeCriticalSectionAndSpinCount(LPCRITICAL_SECTION lpCriticalSection,
                                           DWORD dwSpinCount)
{
    BOOL bRet = TRUE;
    PERF_ENTRY(InitializeCriticalSectionAndSpinCount);
    ENTRY("InitializeCriticalSectionAndSpinCount(lpCriticalSection=%p, "
          "dwSpinCount=%u)\n", lpCriticalSection, dwSpinCount);

    InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,
                                                  dwSpinCount, false);

    LOGEXIT("InitializeCriticalSectionAndSpinCount returns BOOL %d\n",
            bRet);
    PERF_EXIT(InitializeCriticalSectionAndSpinCount);
    return bRet;
}